

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusCrsAtPoint.cpp
# Opt level: O0

double GeoCalcs::LocusCrsAtPoint
                 (Locus *locus,LLPoint *testPt,LLPoint *geoPt,double *dPerpCrs,double dTol)

{
  bool bVar1;
  double dVar2;
  Locus *local_68;
  Locus *local_60;
  double dLocusCrs;
  InverseResult result;
  double dTol_local;
  double *dPerpCrs_local;
  LLPoint *geoPt_local;
  LLPoint *testPt_local;
  Locus *locus_local;
  
  result.distance = dTol;
  bVar1 = PtIsOnLocus(locus,testPt,geoPt,dTol);
  if (bVar1) {
    INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&dLocusCrs);
    DistVincenty(testPt,geoPt,(InverseResult *)&dLocusCrs);
    *dPerpCrs = dLocusCrs;
    DistVincenty(&locus->geoStart,&locus->geoEnd,(InverseResult *)&dLocusCrs);
    dVar2 = atan((locus->endDist - locus->startDist) / result.reverseAzimuth);
    *dPerpCrs = dVar2 + *dPerpCrs;
    dVar2 = DistToLocusP(locus,geoPt,result.distance,5e-16);
    if (0.0 <= dVar2) {
      local_60 = (Locus *)(*dPerpCrs + 1.5707963267948966);
    }
    else {
      local_60 = (Locus *)(*dPerpCrs - 1.5707963267948966);
    }
    if ((double)local_60 <= 6.283185307179586) {
      local_68 = local_60;
    }
    else {
      local_68 = (Locus *)((double)local_60 - 6.283185307179586);
    }
    locus_local = local_68;
  }
  else {
    locus_local = (Locus *)0xbff0000000000000;
  }
  return (double)locus_local;
}

Assistant:

double LocusCrsAtPoint(const Locus &locus, const LLPoint &testPt, LLPoint &geoPt,
                           double &dPerpCrs, const double dTol)
    {
        if (!PtIsOnLocus(locus, testPt, geoPt, dTol))
            return -1.0;

        InverseResult result;
        DistVincenty(testPt, geoPt, result);
        dPerpCrs = result.azimuth;

        DistVincenty(locus.geoStart, locus.geoEnd, result);
        dPerpCrs += atan((locus.endDist - locus.startDist) / result.distance);

        const double dLocusCrs = DistToLocusP(locus, geoPt, dTol, kEps) < 0 ?
                                 dPerpCrs - M_PI_2 : dPerpCrs + M_PI_2;

        return dLocusCrs > M_2PI ? dLocusCrs - M_2PI : dLocusCrs;
    }